

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  byte bVar1;
  char cVar2;
  Table *pTVar3;
  sqlite3_vtab *psVar4;
  sqlite3_module *psVar5;
  long lVar6;
  byte *pbVar7;
  u8 uVar8;
  u8 uVar9;
  undefined4 uVar10;
  int iVar11;
  char *z2;
  VTable *pVVar12;
  byte *p;
  char *pcVar13;
  FuncDef *__s;
  long lVar14;
  size_t __n;
  uint uVar15;
  FuncDef *pFVar16;
  FuncDef *pFVar17;
  byte bVar18;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc;
  void *local_40;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *local_38;
  
  bVar18 = 0;
  local_38 = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  local_40 = (void *)0x0;
  if ((((pExpr != (Expr *)0x0) && (pExpr->op == 0x98)) &&
      (pTVar3 = pExpr->pTab, pTVar3 != (Table *)0x0)) && ((pTVar3->tabFlags & 0x10) != 0)) {
    for (pVVar12 = pTVar3->pVTable; (pVVar12 != (VTable *)0x0 && (pVVar12->db != db));
        pVVar12 = pVVar12->pNext) {
    }
    psVar4 = pVVar12->pVtab;
    psVar5 = psVar4->pModule;
    if ((psVar5->xFindFunction !=
         (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
       (p = (byte *)sqlite3DbStrDup(db,pDef->zName), p != (byte *)0x0)) {
      bVar1 = *p;
      pbVar7 = p;
      while (bVar1 != 0) {
        *pbVar7 = ""[bVar1];
        bVar1 = pbVar7[1];
        pbVar7 = pbVar7 + 1;
      }
      iVar11 = (*psVar5->xFindFunction)(psVar4,nArg,(char *)p,&local_38,&local_40);
      sqlite3DbFree(db,p);
      if (iVar11 != 0) {
        pcVar13 = pDef->zName;
        if (pcVar13 == (char *)0x0) {
          uVar15 = 0x49;
        }
        else {
          uVar15 = 0xffffffff;
          do {
            uVar15 = uVar15 + 1;
            cVar2 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 != '\0');
          uVar15 = (uVar15 & 0x3fffffff) + 0x49;
        }
        __s = (FuncDef *)sqlite3DbMallocRaw(db,uVar15);
        if (__s != (FuncDef *)0x0) {
          memset(__s,0,(ulong)uVar15);
          pFVar16 = pDef;
          pFVar17 = __s;
          for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar8 = pFVar16->iPrefEnc;
            uVar9 = pFVar16->flags;
            uVar10 = *(undefined4 *)&pFVar16->field_0x4;
            pFVar17->nArg = pFVar16->nArg;
            pFVar17->iPrefEnc = uVar8;
            pFVar17->flags = uVar9;
            *(undefined4 *)&pFVar17->field_0x4 = uVar10;
            pFVar16 = (FuncDef *)((long)pFVar16 + (ulong)bVar18 * -0x10 + 8);
            pFVar17 = (FuncDef *)((long)pFVar17 + (ulong)bVar18 * -0x10 + 8);
          }
          __s->zName = (char *)(__s + 1);
          pcVar13 = pDef->zName;
          if (pcVar13 == (char *)0x0) {
            __n = 1;
          }
          else {
            lVar14 = -1;
            do {
              lVar6 = lVar14 + 1;
              lVar14 = lVar14 + 1;
            } while (pcVar13[lVar6] != '\0');
            __n = (ulong)((uint)lVar14 & 0x3fffffff) + 1;
          }
          memcpy(__s + 1,pcVar13,__n);
          __s->xFunc = local_38;
          __s->pUserData = local_40;
          __s->flags = __s->flags | 4;
          pDef = __s;
        }
      }
    }
  }
  return pDef;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;
  char *zLowerName;
  unsigned char *z;


  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  pTab = pExpr->pTab;
  if( NEVER(pTab==0) ) return pDef;
  if( (pTab->tabFlags & TF_Virtual)==0 ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;
 
  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function 
  */
  zLowerName = sqlite3DbStrDup(db, pDef->zName);
  if( zLowerName ){
    for(z=(unsigned char*)zLowerName; *z; z++){
      *z = sqlite3UpperToLower[*z];
    }
    rc = pMod->xFindFunction(pVtab, nArg, zLowerName, &xFunc, &pArg);
    sqlite3DbFree(db, zLowerName);
  }
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (char *)&pNew[1];
  memcpy(pNew->zName, pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xFunc = xFunc;
  pNew->pUserData = pArg;
  pNew->flags |= SQLITE_FUNC_EPHEM;
  return pNew;
}